

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

Nullable<absl::cord_internal::CordRep_*> __thiscall
absl::lts_20240722::Cord::InlineRep::clear(InlineRep *this)

{
  CordzInfo *pCVar1;
  Nullable<absl::cord_internal::CordRep_*> pCVar2;
  
  if (((this->data_).rep_.field_0.data[0] & 1U) != 0) {
    pCVar1 = cord_internal::InlineData::cordz_info(&this->data_);
    if (pCVar1 != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Untrack();
    }
  }
  pCVar2 = tree(this);
  (this->data_).rep_.field_0.as_tree.cordz_info = 0;
  (this->data_).rep_.field_0.as_tree.rep = (CordRep *)0x0;
  return pCVar2;
}

Assistant:

inline absl::Nullable<absl::cord_internal::CordRep*> Cord::InlineRep::clear() {
  if (is_tree()) {
    CordzInfo::MaybeUntrackCord(cordz_info());
  }
  absl::cord_internal::CordRep* result = tree();
  ResetToEmpty();
  return result;
}